

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::TestRegistry::TestRegistry(TestRegistry *this)

{
  (this->super_ITestCaseRegistry)._vptr_ITestCaseRegistry =
       (_func_int **)&PTR__TestRegistry_001a5d50;
  (this->m_functions).super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_functions).super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->m_functions).super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->m_functions).super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->m_sortedFunctions).super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_sortedFunctions).super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_sortedFunctions).super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_unnamedCount = 0;
  std::ios_base::Init::Init(&this->m_ostreamInit);
  return;
}

Assistant:

TestRegistry()
        :   m_currentSortOrder( RunTests::InDeclarationOrder ),
            m_unnamedCount( 0 )
        {}